

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

void __thiscall Server::start(Server *this)

{
  element_type *peVar1;
  EventLoop *this_00;
  shared_ptr<Channel> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  EventLoopThreadPool::start
            ((this->eventLoopThreadPool_)._M_t.
             super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>.
             _M_t.
             super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
             .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->events_ = 0x80000001;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = handNewConn;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Server **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(Server::*(Server_*))()>_>::_M_invoke
  ;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(Server::*(Server_*))()>_>::_M_manager;
  std::function<void_()>::operator=(&peVar1->readHandler_,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = handThisConn;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Server **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(Server::*(Server_*))()>_>::_M_invoke
  ;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(Server::*(Server_*))()>_>::_M_manager;
  std::function<void_()>::operator=(&peVar1->connHandler_,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this_00 = this->loop_;
  local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  EventLoop::addToPoller(this_00,&local_68,0);
  if (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  this->started_ = true;
  return;
}

Assistant:

void Server::start() {
  eventLoopThreadPool_->start();
  // acceptChannel_->setEvents(EPOLLIN | EPOLLET | EPOLLONESHOT);
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
  acceptChannel_->setReadHandler(bind(&Server::handNewConn, this));
  acceptChannel_->setConnHandler(bind(&Server::handThisConn, this));
  loop_->addToPoller(acceptChannel_, 0);
  started_ = true;
}